

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_bool32
drwav__read_fmt(drwav_read_proc onRead,drwav_seek_proc onSeek,void *pUserData,
               drwav_container container,drwav_uint64 *pRunningBytesReadOut,drwav_fmt *fmtOut)

{
  drwav_result dVar1;
  drwav_bool32 dVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int in_ECX;
  undefined8 in_RDX;
  code *in_RSI;
  code *in_RDI;
  long *in_R8;
  short *in_R9;
  bool bVar6;
  drwav_uint8 fmtext [22];
  int bytesReadSoFar;
  drwav_uint8 fmt_cbSize [2];
  drwav_uint8 fmt [16];
  drwav_chunk_header header;
  int i_1;
  int i;
  int i_2;
  void *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb4;
  byte in_stack_fffffffffffffeb5;
  byte bVar7;
  undefined1 in_stack_fffffffffffffeb7;
  drwav_chunk_header *in_stack_fffffffffffffeb8;
  drwav_uint64 *in_stack_fffffffffffffec0;
  drwav_container in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  int iVar8;
  undefined4 in_stack_fffffffffffffed4;
  short sVar9;
  drwav_read_proc in_stack_fffffffffffffed8;
  undefined4 local_120;
  short local_11c;
  short local_11a [5];
  drwav_uint8 local_110 [16];
  ulong local_100;
  uint local_f8;
  short *local_f0;
  long *local_e8;
  int local_dc;
  undefined8 local_d8;
  code *local_d0;
  code *local_c8;
  drwav_bool32 local_bc;
  undefined1 *local_b8;
  undefined1 *local_b0;
  short *local_a8;
  short *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined4 *local_80;
  undefined1 *local_78;
  int local_6c;
  drwav_uint8 *local_68;
  drwav_uint8 *local_60;
  int local_58;
  int local_54;
  drwav_uint8 *local_50;
  drwav_uint8 *local_48;
  int local_3c;
  char *local_38;
  drwav_uint8 *local_30;
  char *local_28;
  drwav_uint8 *local_20;
  int local_14;
  short *local_10;
  undefined1 *local_8;
  
  local_f0 = in_R9;
  local_e8 = in_R8;
  local_dc = in_ECX;
  local_d8 = in_RDX;
  local_d0 = in_RSI;
  local_c8 = in_RDI;
  dVar1 = drwav__read_chunk_header
                    (in_stack_fffffffffffffed8,
                     (void *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (dVar1 != 0) {
    return 0;
  }
  do {
    if ((local_dc == 0) || (local_dc == 2)) {
      local_20 = local_110;
      local_28 = "fmt ";
      in_stack_fffffffffffffeb7 = false;
      if ((local_110[0] == 'f') &&
         ((in_stack_fffffffffffffeb7 = false, local_110[1] == 'm' &&
          (in_stack_fffffffffffffeb7 = false, local_110[2] == 't')))) {
        in_stack_fffffffffffffeb7 = local_110[3] == ' ';
      }
      bVar7 = 1;
      if ((bool)in_stack_fffffffffffffeb7 != false) goto LAB_00113292;
    }
    else {
LAB_00113292:
      in_stack_fffffffffffffeb5 = 0;
      bVar7 = in_stack_fffffffffffffeb5;
      if (local_dc == 1) {
        local_48 = local_110;
        local_50 = drwavGUID_W64_FMT;
        for (local_54 = 0; local_54 < 0x10; local_54 = local_54 + 1) {
          if (local_48[local_54] != drwavGUID_W64_FMT[local_54]) {
            local_3c = 0;
            goto LAB_0011332b;
          }
        }
        local_3c = 1;
LAB_0011332b:
        in_stack_fffffffffffffeb5 = local_3c != 0 ^ 0xff;
        bVar7 = in_stack_fffffffffffffeb5;
      }
    }
    if ((bVar7 & 1) == 0) {
      if ((local_dc != 0) && (local_dc != 2)) {
        local_60 = local_110;
        local_68 = drwavGUID_W64_FMT;
        local_6c = 0;
        break;
      }
      local_30 = local_110;
      local_38 = "fmt ";
      bVar6 = false;
      if (((local_110[0] == 'f') && (bVar6 = false, local_110[1] == 'm')) &&
         (bVar6 = false, local_110[2] == 't')) {
        bVar6 = local_110[3] == ' ';
      }
      if (!bVar6) {
        return 0;
      }
      goto LAB_00113555;
    }
    dVar2 = drwav__seek_forward((drwav_seek_proc)in_stack_fffffffffffffeb8,
                                CONCAT17(in_stack_fffffffffffffeb7,
                                         CONCAT16(bVar7,CONCAT15(in_stack_fffffffffffffeb5,
                                                                 CONCAT14(in_stack_fffffffffffffeb4,
                                                                          in_stack_fffffffffffffeb0)
                                                                ))),in_stack_fffffffffffffea8);
    if (dVar2 == 0) {
      return 0;
    }
    *local_e8 = local_100 + local_f8 + *local_e8;
    dVar1 = drwav__read_chunk_header
                      (in_stack_fffffffffffffed8,
                       (void *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8
                      );
    if (dVar1 != 0) {
      return 0;
    }
  } while( true );
LAB_001134d8:
  if (0xf < local_6c) {
    local_58 = 1;
LAB_00113539:
    if (local_58 == 0) {
      local_bc = 0;
    }
    else {
LAB_00113555:
      lVar4 = (*local_c8)(local_d8,&stack0xfffffffffffffed8,0x10);
      sVar9 = (short)((uint)in_stack_fffffffffffffed4 >> 0x10);
      if (lVar4 == 0x10) {
        *local_e8 = *local_e8 + 0x10;
        local_90 = &stack0xfffffffffffffed8;
        *local_f0 = (short)in_stack_fffffffffffffed8;
        local_98 = &stack0xfffffffffffffeda;
        local_f0[1] = (short)((ulong)in_stack_fffffffffffffed8 >> 0x10);
        local_78 = &stack0xfffffffffffffedc;
        *(int *)(local_f0 + 2) = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
        local_80 = &local_120;
        *(undefined4 *)(local_f0 + 4) = local_120;
        local_a0 = &local_11c;
        local_f0[6] = local_11c;
        local_a8 = local_11a;
        local_f0[7] = local_11a[0];
        local_f0[8] = 0;
        local_f0[9] = 0;
        local_f0[10] = 0;
        local_f0[0xb] = 0;
        memset(local_f0 + 0xc,0,0x10);
        if (0x10 < local_100) {
          lVar4 = (*local_c8)(local_d8,&stack0xfffffffffffffed6,2);
          if (lVar4 != 2) {
            return 0;
          }
          *local_e8 = *local_e8 + 2;
          iVar8 = 0x12;
          local_b0 = &stack0xfffffffffffffed6;
          local_f0[8] = sVar9;
          if (local_f0[8] != 0) {
            if ((*local_f0 == -2) && (local_f0[8] != 0x16)) {
              return 0;
            }
            if (*local_f0 == -2) {
              uVar5 = (*local_c8)(local_d8,&stack0xfffffffffffffeb8,local_f0[8]);
              if (uVar5 != (ushort)local_f0[8]) {
                return 0;
              }
              local_b8 = &stack0xfffffffffffffeb8;
              local_f0[9] = (short)in_stack_fffffffffffffeb8;
              local_88 = &stack0xfffffffffffffeba;
              *(int *)(local_f0 + 10) = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x10);
              local_8 = &stack0xfffffffffffffebe;
              local_10 = local_f0 + 0xc;
              for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
                *(undefined1 *)((long)local_10 + (long)local_14) = local_8[local_14];
              }
            }
            else {
              iVar3 = (*local_d0)(local_d8,local_f0[8],1);
              if (iVar3 == 0) {
                return 0;
              }
            }
            *local_e8 = (ulong)(ushort)local_f0[8] + *local_e8;
            iVar8 = (uint)(ushort)local_f0[8] + iVar8;
          }
          iVar3 = (*local_d0)(local_d8,local_100 - (long)iVar8 & 0xffffffff,1);
          if (iVar3 == 0) {
            return 0;
          }
          *local_e8 = (local_100 - (long)iVar8) + *local_e8;
        }
        if (local_f8 != 0) {
          iVar8 = (*local_d0)(local_d8,local_f8,1);
          if (iVar8 == 0) {
            return 0;
          }
          *local_e8 = (ulong)local_f8 + *local_e8;
        }
        local_bc = 1;
      }
      else {
        local_bc = 0;
      }
    }
    return local_bc;
  }
  if (local_60[local_6c] != drwavGUID_W64_FMT[local_6c]) {
    local_58 = 0;
    goto LAB_00113539;
  }
  local_6c = local_6c + 1;
  goto LAB_001134d8;
}

Assistant:

static drwav_bool32 drwav__read_fmt(drwav_read_proc onRead, drwav_seek_proc onSeek, void* pUserData, drwav_container container, drwav_uint64* pRunningBytesReadOut, drwav_fmt* fmtOut)
{
    drwav_chunk_header header;
    drwav_uint8 fmt[16];

    if (drwav__read_chunk_header(onRead, pUserData, container, pRunningBytesReadOut, &header) != DRWAV_SUCCESS) {
        return DRWAV_FALSE;
    }


    /* Skip non-fmt chunks. */
    while (((container == drwav_container_riff || container == drwav_container_rf64) && !drwav__fourcc_equal(header.id.fourcc, "fmt ")) || (container == drwav_container_w64 && !drwav__guid_equal(header.id.guid, drwavGUID_W64_FMT))) {
        if (!drwav__seek_forward(onSeek, header.sizeInBytes + header.paddingSize, pUserData)) {
            return DRWAV_FALSE;
        }
        *pRunningBytesReadOut += header.sizeInBytes + header.paddingSize;

        /* Try the next header. */
        if (drwav__read_chunk_header(onRead, pUserData, container, pRunningBytesReadOut, &header) != DRWAV_SUCCESS) {
            return DRWAV_FALSE;
        }
    }


    /* Validation. */
    if (container == drwav_container_riff || container == drwav_container_rf64) {
        if (!drwav__fourcc_equal(header.id.fourcc, "fmt ")) {
            return DRWAV_FALSE;
        }
    } else {
        if (!drwav__guid_equal(header.id.guid, drwavGUID_W64_FMT)) {
            return DRWAV_FALSE;
        }
    }


    if (onRead(pUserData, fmt, sizeof(fmt)) != sizeof(fmt)) {
        return DRWAV_FALSE;
    }
    *pRunningBytesReadOut += sizeof(fmt);

    fmtOut->formatTag      = drwav__bytes_to_u16(fmt + 0);
    fmtOut->channels       = drwav__bytes_to_u16(fmt + 2);
    fmtOut->sampleRate     = drwav__bytes_to_u32(fmt + 4);
    fmtOut->avgBytesPerSec = drwav__bytes_to_u32(fmt + 8);
    fmtOut->blockAlign     = drwav__bytes_to_u16(fmt + 12);
    fmtOut->bitsPerSample  = drwav__bytes_to_u16(fmt + 14);

    fmtOut->extendedSize       = 0;
    fmtOut->validBitsPerSample = 0;
    fmtOut->channelMask        = 0;
    memset(fmtOut->subFormat, 0, sizeof(fmtOut->subFormat));

    if (header.sizeInBytes > 16) {
        drwav_uint8 fmt_cbSize[2];
        int bytesReadSoFar = 0;

        if (onRead(pUserData, fmt_cbSize, sizeof(fmt_cbSize)) != sizeof(fmt_cbSize)) {
            return DRWAV_FALSE;    /* Expecting more data. */
        }
        *pRunningBytesReadOut += sizeof(fmt_cbSize);

        bytesReadSoFar = 18;

        fmtOut->extendedSize = drwav__bytes_to_u16(fmt_cbSize);
        if (fmtOut->extendedSize > 0) {
            /* Simple validation. */
            if (fmtOut->formatTag == DR_WAVE_FORMAT_EXTENSIBLE) {
                if (fmtOut->extendedSize != 22) {
                    return DRWAV_FALSE;
                }
            }

            if (fmtOut->formatTag == DR_WAVE_FORMAT_EXTENSIBLE) {
                drwav_uint8 fmtext[22];
                if (onRead(pUserData, fmtext, fmtOut->extendedSize) != fmtOut->extendedSize) {
                    return DRWAV_FALSE;    /* Expecting more data. */
                }

                fmtOut->validBitsPerSample = drwav__bytes_to_u16(fmtext + 0);
                fmtOut->channelMask        = drwav__bytes_to_u32(fmtext + 2);
                drwav__bytes_to_guid(fmtext + 6, fmtOut->subFormat);
            } else {
                if (!onSeek(pUserData, fmtOut->extendedSize, drwav_seek_origin_current)) {
                    return DRWAV_FALSE;
                }
            }
            *pRunningBytesReadOut += fmtOut->extendedSize;

            bytesReadSoFar += fmtOut->extendedSize;
        }

        /* Seek past any leftover bytes. For w64 the leftover will be defined based on the chunk size. */
        if (!onSeek(pUserData, (int)(header.sizeInBytes - bytesReadSoFar), drwav_seek_origin_current)) {
            return DRWAV_FALSE;
        }
        *pRunningBytesReadOut += (header.sizeInBytes - bytesReadSoFar);
    }

    if (header.paddingSize > 0) {
        if (!onSeek(pUserData, header.paddingSize, drwav_seek_origin_current)) {
            return DRWAV_FALSE;
        }
        *pRunningBytesReadOut += header.paddingSize;
    }

    return DRWAV_TRUE;
}